

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void __thiscall
duckdb::
StandardColumnWriter<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
::FinalizeAnalyze(StandardColumnWriter<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
                  *this,ColumnWriterState *state_p)

{
  bool bVar1;
  ParquetVersion PVar2;
  byte bVar3;
  type tVar4;
  StandardColumnWriterState<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
  *pSVar5;
  idx_t iVar6;
  ParquetWriter *in_RDI;
  StandardColumnWriterState<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
  *state;
  type type;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  ColumnWriter::SchemaIndex((ColumnWriter *)in_RDI);
  tVar4 = ParquetWriter::GetType
                    (in_RDI,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  pSVar5 = ColumnWriterState::
           Cast<duckdb::StandardColumnWriterState<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType,duckdb::ParquetUUIDOperator>>
                     ((ColumnWriterState *)in_RDI);
  iVar6 = PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
          ::GetSize(&pSVar5->dictionary);
  if ((iVar6 == 0) ||
     (bVar1 = PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
              ::IsFull(&pSVar5->dictionary), bVar1)) {
    PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
    ::Reset((PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
             *)in_RDI);
    PVar2 = ParquetWriter::GetParquetVersion(*(ParquetWriter **)&in_RDI->file_name);
    if (PVar2 == V1) {
      pSVar5->encoding = PLAIN;
    }
    else if (tVar4 - INT32 < 2) {
      pSVar5->encoding = DELTA_BINARY_PACKED;
    }
    else if (tVar4 - FLOAT < 2) {
      pSVar5->encoding = BYTE_STREAM_SPLIT;
    }
    else if (tVar4 == BYTE_ARRAY) {
      pSVar5->encoding = DELTA_LENGTH_BYTE_ARRAY;
    }
    else {
      pSVar5->encoding = PLAIN;
    }
  }
  else {
    iVar6 = PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
            ::GetSize(&pSVar5->dictionary);
    bVar3 = RleBpDecoder::ComputeBitWidth(iVar6);
    pSVar5->key_bit_width = (uint)bVar3;
  }
  return;
}

Assistant:

void FinalizeAnalyze(ColumnWriterState &state_p) override {
		const auto type = writer.GetType(SchemaIndex());

		auto &state = state_p.Cast<StandardColumnWriterState<SRC, TGT, OP>>();
		if (state.dictionary.GetSize() == 0 || state.dictionary.IsFull()) {
			state.dictionary.Reset();
			if (writer.GetParquetVersion() == ParquetVersion::V1) {
				// Can't do the cool stuff for V1
				state.encoding = duckdb_parquet::Encoding::PLAIN;
			} else {
				// If we aren't doing dictionary encoding, these encodings are virtually always better than PLAIN
				switch (type) {
				case duckdb_parquet::Type::type::INT32:
				case duckdb_parquet::Type::type::INT64:
					state.encoding = duckdb_parquet::Encoding::DELTA_BINARY_PACKED;
					break;
				case duckdb_parquet::Type::type::BYTE_ARRAY:
					state.encoding = duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY;
					break;
				case duckdb_parquet::Type::type::FLOAT:
				case duckdb_parquet::Type::type::DOUBLE:
					state.encoding = duckdb_parquet::Encoding::BYTE_STREAM_SPLIT;
					break;
				default:
					state.encoding = duckdb_parquet::Encoding::PLAIN;
				}
			}
		} else {
			state.key_bit_width = RleBpDecoder::ComputeBitWidth(state.dictionary.GetSize());
		}
	}